

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O0

size_t HUF_readStats(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                    U32 *tableLogPtr,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  int *in_RCX;
  void *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint *in_R8;
  byte *in_R9;
  U32 lastWeight;
  U32 verif;
  U32 rest;
  U32 total;
  U32 tableLog;
  U32 n_1;
  FSE_DTable fseWorkspace [65];
  U32 n;
  size_t oSize;
  size_t iSize;
  BYTE *ip;
  U32 weightTotal;
  uint local_16c;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  U32 local_3c;
  size_t local_8;
  
  if (_lastWeight == 0) {
    return 0xffffffffffffffb8;
  }
  local_50 = (ulong)*in_R9;
  if (local_50 < 0x80) {
    if (_lastWeight < local_50 + 1) {
      return 0xffffffffffffffb8;
    }
    local_58 = FSE_decompress_wksp((void *)fseWorkspace._168_8_,fseWorkspace._160_8_,
                                   (void *)fseWorkspace._152_8_,fseWorkspace._144_8_,
                                   (FSE_DTable *)fseWorkspace._136_8_,fseWorkspace[0x21]);
    uVar1 = FSE_isError(0x248c55);
    if (uVar1 != 0) {
      return local_58;
    }
  }
  else {
    local_58 = local_50 - 0x7f;
    local_50 = local_50 - 0x7e >> 1;
    if (_lastWeight < local_50 + 1) {
      return 0xffffffffffffffb8;
    }
    if (in_RSI <= local_58) {
      return 0xffffffffffffffec;
    }
    for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 2) {
      *(char *)(in_RDI + (ulong)local_5c) =
           (char)((int)(uint)in_R9[(ulong)(local_5c >> 1) + 1] >> 4);
      *(byte *)(in_RDI + (ulong)(local_5c + 1)) = in_R9[(ulong)(local_5c >> 1) + 1] & 0xf;
    }
  }
  memset(in_RDX,0,0x34);
  local_3c = 0;
  local_16c = 0;
  while( true ) {
    if (local_58 <= local_16c) {
      if (local_3c == 0) {
        local_8 = 0xffffffffffffffec;
      }
      else {
        uVar1 = BIT_highbit32(local_3c);
        uVar1 = uVar1 + 1;
        if (uVar1 < 0xd) {
          *in_R8 = uVar1;
          local_3c = (1 << ((byte)uVar1 & 0x1f)) - local_3c;
          uVar1 = BIT_highbit32(local_3c);
          uVar2 = BIT_highbit32(local_3c);
          uVar2 = uVar2 + 1;
          if (1 << ((byte)uVar1 & 0x1f) == local_3c) {
            *(char *)(in_RDI + local_58) = (char)uVar2;
            *(int *)((long)in_RDX + (ulong)uVar2 * 4) =
                 *(int *)((long)in_RDX + (ulong)uVar2 * 4) + 1;
            if ((*(uint *)((long)in_RDX + 4) < 2) || ((*(uint *)((long)in_RDX + 4) & 1) != 0)) {
              local_8 = 0xffffffffffffffec;
            }
            else {
              *in_RCX = (int)local_58 + 1;
              local_8 = local_50 + 1;
            }
          }
          else {
            local_8 = 0xffffffffffffffec;
          }
        }
        else {
          local_8 = 0xffffffffffffffec;
        }
      }
      return local_8;
    }
    if (0xb < *(byte *)(in_RDI + (ulong)local_16c)) break;
    *(int *)((long)in_RDX + (ulong)*(byte *)(in_RDI + (ulong)local_16c) * 4) =
         *(int *)((long)in_RDX + (ulong)*(byte *)(in_RDI + (ulong)local_16c) * 4) + 1;
    local_3c = ((1 << (*(byte *)(in_RDI + (ulong)local_16c) & 0x1f)) >> 1) + local_3c;
    local_16c = local_16c + 1;
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t HUF_readStats(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize)
{
    U32 weightTotal;
    const BYTE* ip = (const BYTE*) src;
    size_t iSize;
    size_t oSize;

    if (!srcSize) return ERROR(srcSize_wrong);
    iSize = ip[0];
    /* memset(huffWeight, 0, hwSize);   *//* is not necessary, even though some analyzer complain ... */

    if (iSize >= 128) {  /* special header */
        oSize = iSize - 127;
        iSize = ((oSize+1)/2);
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        if (oSize >= hwSize) return ERROR(corruption_detected);
        ip += 1;
        {   U32 n;
            for (n=0; n<oSize; n+=2) {
                huffWeight[n]   = ip[n/2] >> 4;
                huffWeight[n+1] = ip[n/2] & 15;
    }   }   }
    else  {   /* header compressed with FSE (normal case) */
        FSE_DTable fseWorkspace[FSE_DTABLE_SIZE_U32(6)];  /* 6 is max possible tableLog for HUF header (maybe even 5, to be tested) */
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        oSize = FSE_decompress_wksp(huffWeight, hwSize-1, ip+1, iSize, fseWorkspace, 6);   /* max (hwSize-1) values decoded, as last one is implied */
        if (FSE_isError(oSize)) return oSize;
    }

    /* collect weight stats */
    memset(rankStats, 0, (HUF_TABLELOG_MAX + 1) * sizeof(U32));
    weightTotal = 0;
    {   U32 n; for (n=0; n<oSize; n++) {
            if (huffWeight[n] >= HUF_TABLELOG_MAX) return ERROR(corruption_detected);
            rankStats[huffWeight[n]]++;
            weightTotal += (1 << huffWeight[n]) >> 1;
    }   }
    if (weightTotal == 0) return ERROR(corruption_detected);

    /* get last non-null symbol weight (implied, total must be 2^n) */
    {   U32 const tableLog = BIT_highbit32(weightTotal) + 1;
        if (tableLog > HUF_TABLELOG_MAX) return ERROR(corruption_detected);
        *tableLogPtr = tableLog;
        /* determine last weight */
        {   U32 const total = 1 << tableLog;
            U32 const rest = total - weightTotal;
            U32 const verif = 1 << BIT_highbit32(rest);
            U32 const lastWeight = BIT_highbit32(rest) + 1;
            if (verif != rest) return ERROR(corruption_detected);    /* last value must be a clean power of 2 */
            huffWeight[oSize] = (BYTE)lastWeight;
            rankStats[lastWeight]++;
    }   }

    /* check tree construction validity */
    if ((rankStats[1] < 2) || (rankStats[1] & 1)) return ERROR(corruption_detected);   /* by construction : at least 2 elts of rank 1, must be even */

    /* results */
    *nbSymbolsPtr = (U32)(oSize+1);
    return iSize+1;
}